

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_request_state(connectdata *conn,_Bool *done)

{
  int iVar1;
  undefined4 uVar2;
  smb_nt_create_response *psVar3;
  smb_nt_create_response *smb_m;
  void *msg;
  unsigned_short local_40;
  ushort local_3e;
  CURLcode result;
  unsigned_short off;
  unsigned_short len;
  smb_req_state next_state;
  smb_conn *smbc;
  smb_header *h;
  smb_request *req;
  _Bool *done_local;
  connectdata *conn_local;
  
  h = (smb_header *)(conn->data->req).protop;
  _off = &conn->proto;
  result = CURLE_COULDNT_CONNECT;
  smb_m = (smb_nt_create_response *)0x0;
  iVar1._0_1_ = h->nbt_type;
  iVar1._1_1_ = h->nbt_flags;
  iVar1._2_2_ = h->nbt_length;
  req = (smb_request *)done;
  done_local = (_Bool *)conn;
  if (iVar1 == 0) {
    msg._4_4_ = smb_send_tree_connect(conn);
    if (msg._4_4_ != CURLE_OK) {
      Curl_conncontrol((connectdata *)done_local,1);
      return msg._4_4_;
    }
    request_state((connectdata *)done_local,SMB_TREE_CONNECT);
  }
  msg._4_4_ = smb_send_and_recv((connectdata *)done_local,&smb_m);
  psVar3 = smb_m;
  if ((msg._4_4_ != CURLE_OK) && (msg._4_4_ != CURLE_AGAIN)) {
    Curl_conncontrol((connectdata *)done_local,1);
    return msg._4_4_;
  }
  if (smb_m == (smb_nt_create_response *)0x0) {
    return CURLE_OK;
  }
  smbc = (smb_conn *)smb_m;
  uVar2._0_1_ = h->nbt_type;
  uVar2._1_1_ = h->nbt_flags;
  uVar2._2_2_ = h->nbt_length;
  switch(uVar2) {
  case 1:
    if ((smb_m->h).status == 0) {
      h->pid_high = (smb_m->h).tid;
      result = CURLE_FAILED_INIT;
    }
    else {
      h->signature[2] = 'N';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      if ((smb_m->h).status == 0x50001) {
        h->signature[2] = '\t';
        h->signature[3] = '\0';
        h->signature[4] = '\0';
        h->signature[5] = '\0';
      }
    }
    break;
  case 2:
    if (((smb_m->h).status == 0) && (99 < (ulong)(_off->ftpc).pp.response_time)) {
      *(unsigned_short *)h->signature = smb_m->fid;
      *(undefined8 *)(*(long *)done_local + 0x178) = 0;
      if ((*(ulong *)(*(long *)done_local + 0xee0) >> 0x1d & 1) == 0) {
        *(curl_off_t *)(*(long *)done_local + 0xf0) = smb_m->end_of_file;
        if (*(long *)(*(long *)done_local + 0xf0) < 0) {
          h->signature[2] = '\b';
          h->signature[3] = '\0';
          h->signature[4] = '\0';
          h->signature[5] = '\0';
          result = CURLE_COULDNT_RESOLVE_PROXY;
        }
        else {
          Curl_pgrsSetDownloadSize
                    (*(Curl_easy **)done_local,*(curl_off_t *)(*(long *)done_local + 0xf0));
          if ((*(ulong *)(*(long *)done_local + 0xee0) >> 9 & 1) != 0) {
            get_posix_time((time_t *)(*(long *)done_local + 0x15e8),psVar3->last_change_time);
          }
          result = CURLE_URL_MALFORMAT;
        }
      }
      else {
        *(undefined8 *)(*(long *)done_local + 0xf0) = *(undefined8 *)(*(long *)done_local + 0x14f8);
        Curl_pgrsSetUploadSize
                  (*(Curl_easy **)done_local,*(curl_off_t *)(*(long *)done_local + 0xf0));
        result = CURLE_NOT_BUILT_IN;
      }
    }
    else {
      h->signature[2] = 'N';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      result = CURLE_COULDNT_RESOLVE_HOST;
    }
    break;
  case 3:
    if (((smb_m->h).status == 0) && (0x31 < (ulong)(_off->ftpc).pp.response_time)) {
      local_3e = Curl_read16_le((uchar *)((long)&smb_m->create_disposition + 3));
      local_40 = Curl_read16_le((uchar *)((long)&smb_m->create_time + 1));
      if (local_3e != 0) {
        if ((ulong)(_off->ftpc).pp.response_time < (ulong)local_40 + 4 + (ulong)local_3e) {
          Curl_failf(*(Curl_easy **)done_local,"Invalid input packet");
          msg._4_4_ = CURLE_RECV_ERROR;
        }
        else {
          msg._4_4_ = Curl_client_write((connectdata *)done_local,1,
                                        (char *)((smb_m->h).magic + (int)(uint)local_40),
                                        (ulong)local_3e);
        }
        if (msg._4_4_ != CURLE_OK) {
          *(CURLcode *)(h->signature + 2) = msg._4_4_;
          result = CURLE_COULDNT_RESOLVE_PROXY;
          break;
        }
      }
      *(ulong *)(*(long *)done_local + 0x100) =
           (ulong)local_3e + *(long *)(*(long *)done_local + 0x100);
      *(ulong *)(*(long *)done_local + 0x178) =
           (ulong)local_3e + *(long *)(*(long *)done_local + 0x178);
      Curl_pgrsSetDownloadCounter
                (*(Curl_easy **)done_local,*(curl_off_t *)(*(long *)done_local + 0x100));
      result = CURLE_URL_MALFORMAT;
      if (local_3e < 0x8000) {
        result = CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    else {
      h->signature[2] = '8';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      result = CURLE_COULDNT_RESOLVE_PROXY;
    }
    break;
  case 4:
    if (((smb_m->h).status == 0) && (0x29 < (ulong)(_off->ftpc).pp.response_time)) {
      local_3e = Curl_read16_le(&smb_m->op_lock_level);
      *(ulong *)(*(long *)done_local + 0x100) =
           (ulong)local_3e + *(long *)(*(long *)done_local + 0x100);
      *(ulong *)(*(long *)done_local + 0x178) =
           (ulong)local_3e + *(long *)(*(long *)done_local + 0x178);
      Curl_pgrsSetUploadCounter
                (*(Curl_easy **)done_local,*(curl_off_t *)(*(long *)done_local + 0x100));
      if (*(long *)(*(long *)done_local + 0x100) < *(long *)(*(long *)done_local + 0xf0)) {
        result = CURLE_NOT_BUILT_IN;
      }
      else {
        result = CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    else {
      h->signature[2] = '\x19';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      result = CURLE_COULDNT_RESOLVE_PROXY;
    }
    break;
  case 5:
    result = CURLE_COULDNT_RESOLVE_HOST;
    break;
  case 6:
    result = CURLE_COULDNT_CONNECT;
    break;
  default:
    smb_pop_message((connectdata *)done_local);
    return CURLE_OK;
  }
  smb_pop_message((connectdata *)done_local);
  switch(result) {
  case CURLE_FAILED_INIT:
    msg._4_4_ = smb_send_open((connectdata *)done_local);
    break;
  case CURLE_URL_MALFORMAT:
    msg._4_4_ = smb_send_read((connectdata *)done_local);
    break;
  case CURLE_NOT_BUILT_IN:
    msg._4_4_ = smb_send_write((connectdata *)done_local);
    break;
  case CURLE_COULDNT_RESOLVE_PROXY:
    msg._4_4_ = smb_send_close((connectdata *)done_local);
    break;
  case CURLE_COULDNT_RESOLVE_HOST:
    msg._4_4_ = smb_send_tree_disconnect((connectdata *)done_local);
    break;
  case CURLE_COULDNT_CONNECT:
    msg._4_4_ = *(CURLcode *)(h->signature + 2);
    *(undefined1 *)&req->state = SMB_TREE_CONNECT;
  }
  if (msg._4_4_ == CURLE_OK) {
    request_state((connectdata *)done_local,result);
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_conncontrol((connectdata *)done_local,1);
    conn_local._4_4_ = msg._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_request_state(struct connectdata *conn, bool *done)
{
  struct smb_request *req = conn->data->req.protop;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(conn);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(conn, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(conn, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    conn->data->req.offset = 0;
    if(conn->data->set.upload) {
      conn->data->req.size = conn->data->state.infilesize;
      Curl_pgrsSetUploadSize(conn->data, conn->data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      smb_m = (const struct smb_nt_create_response*) msg;
      conn->data->req.size = smb_swap64(smb_m->end_of_file);
      if(conn->data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(conn->data, conn->data->req.size);
        if(conn->data->set.get_filetime)
          get_posix_time(&conn->data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(conn->data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(conn, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetDownloadCounter(conn->data, conn->data->req.bytecount);
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetUploadCounter(conn->data, conn->data->req.bytecount);
    if(conn->data->req.bytecount >= conn->data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(conn);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(conn);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(conn);
    break;

  case SMB_CLOSE:
    result = smb_send_close(conn);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(conn);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(conn, next_state);

  return CURLE_OK;
}